

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostInfo_p.h
# Opt level: O1

void __thiscall BamTools::Internal::HostInfo::~HostInfo(HostInfo *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_errorString)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_errorString).field_2) {
    operator_delete(pcVar1);
  }
  std::vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>::
  ~vector(&this->m_addresses);
  pcVar1 = (this->m_hostName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_hostName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

class API_NO_EXPORT HostInfo
{

public:
    enum ErrorType
    {
        NoError = 0,
        HostNotFound,
        UnknownError
    };

    // ctors & dtor
public:
    HostInfo();

    // HostInfo interface
public:
    std::string HostName() const;
    void SetHostName(const std::string& name);

    std::vector<HostAddress> Addresses() const;
    void SetAddresses(const std::vector<HostAddress>& addresses);

    HostInfo::ErrorType GetError() const;
    std::string GetErrorString() const;

    // internal methods
private:
    void SetError(const HostInfo::ErrorType error);
    void SetErrorString(const std::string& errorString);

    // static methods
public:
    static HostInfo Lookup(const std::string& hostname, const std::string& port);

    // data members
private:
    std::string m_hostName;
    std::vector<HostAddress> m_addresses;
    HostInfo::ErrorType m_error;
    std::string m_errorString;
}